

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O0

CartesianSpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (CartesianSpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          CartesianSpeakerPosition *pos)

{
  tuple<double_&,_double_&,_double_&> local_190;
  ScreenEdgeLock local_178;
  CartesianSpeakerPosition local_118;
  Vector3d local_50;
  tuple<double,_double,_double> local_38;
  CartesianSpeakerPosition *local_20;
  CartesianSpeakerPosition *pos_local;
  GainCalculatorDirectSpeakersImpl *this_local;
  
  local_20 = pos;
  pos_local = (CartesianSpeakerPosition *)this;
  this_local = (GainCalculatorDirectSpeakersImpl *)__return_storage_ptr__;
  CartesianSpeakerPosition::CartesianSpeakerPosition(&local_118,pos);
  toCartesianVector3d(&local_50,&local_118);
  ScreenEdgeLock::ScreenEdgeLock(&local_178,&pos->screenEdgeLock);
  ScreenEdgeLockHandler::handleVector(&local_38,&this->_screenEdgeLockHandler,&local_50,&local_178);
  std::tie<double,double,double>(&local_190,&pos->X,&pos->Y,&pos->Z);
  std::tuple<double&,double&,double&>::operator=
            ((tuple<double&,double&,double&> *)&local_190,&local_38);
  ScreenEdgeLock::~ScreenEdgeLock(&local_178);
  CartesianSpeakerPosition::~CartesianSpeakerPosition(&local_118);
  CartesianSpeakerPosition::CartesianSpeakerPosition(__return_storage_ptr__,pos);
  return __return_storage_ptr__;
}

Assistant:

CartesianSpeakerPosition
  GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      CartesianSpeakerPosition pos) {
    std::tie(pos.X, pos.Y, pos.Z) = _screenEdgeLockHandler.handleVector(
        toCartesianVector3d(pos), pos.screenEdgeLock);
    return pos;
  }